

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  Argument *pAVar4;
  ofstream *out;
  string *out_00;
  _Ios_Openmode _Var5;
  char *out_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string_view aArgumentName;
  string_view aArgumentName_00;
  string_view aArgumentName_01;
  string_view aArgumentName_02;
  string_view aArgumentName_03;
  string_view aArgumentName_04;
  string_view aArgumentName_05;
  string_view aArgumentName_06;
  string_view aArgumentName_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_file;
  ArgumentParser program;
  ifstream inf;
  ofstream outf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  any local_608;
  any local_5f8;
  any local_5e8;
  any local_5d8;
  any local_5c8;
  any local_5b8;
  any local_5a8;
  long *local_598 [2];
  long local_588 [2];
  string local_578;
  ArgumentParser local_558;
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined7 uStack_427;
  undefined8 uStack_420;
  byte abStack_418 [488];
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  pbVar6 = &local_648;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"vm","");
  argparse::ArgumentParser::ArgumentParser(&local_558,&local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"input");
  pAVar4->field_0xbc = pAVar4->field_0xbc | 2;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_458,"speicify the file to be assembled/executed.","");
  std::__cxx11::string::operator=((string *)&pAVar4->mHelp,(string *)local_458);
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"-d");
  local_5a8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5a8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar4->mDefaultValue,&local_5a8);
  local_5b8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5b8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar4->mImplicitValue,&local_5b8);
  pAVar4->mNumArgs = 0;
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_478,"disassemble the binary input file.","");
  std::__cxx11::string::operator=((string *)&pAVar4->mHelp,(string *)local_478);
  if (local_478[0] != local_468) {
    operator_delete(local_478[0],local_468[0] + 1);
  }
  if (local_5b8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5b8._M_manager)(_Op_destroy,&local_5b8,(_Arg *)0x0);
    local_5b8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_5a8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5a8._M_manager)(_Op_destroy,&local_5a8,(_Arg *)0x0);
    local_5a8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"-a");
  local_5c8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5c8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar4->mDefaultValue,&local_5c8);
  local_5d8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5d8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar4->mImplicitValue,&local_5d8);
  pAVar4->mNumArgs = 0;
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,"assemble the text input file.","");
  std::__cxx11::string::operator=((string *)&pAVar4->mHelp,(string *)local_498);
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if (local_5d8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5d8._M_manager)(_Op_destroy,&local_5d8,(_Arg *)0x0);
    local_5d8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_5c8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5c8._M_manager)(_Op_destroy,&local_5c8,(_Arg *)0x0);
    local_5c8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"-r");
  local_5e8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5e8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar4->mDefaultValue,&local_5e8);
  local_5f8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5f8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar4->mImplicitValue,&local_5f8);
  pAVar4->mNumArgs = 0;
  local_4b8[0] = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b8,"interpret the binary input file.","");
  std::__cxx11::string::operator=((string *)&pAVar4->mHelp,(string *)local_4b8);
  if (local_4b8[0] != local_4a8) {
    operator_delete(local_4b8[0],local_4a8[0] + 1);
  }
  if (local_5f8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5f8._M_manager)(_Op_destroy,&local_5f8,(_Arg *)0x0);
    local_5f8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_5e8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_5e8._M_manager)(_Op_destroy,&local_5e8,(_Arg *)0x0);
    local_5e8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>(&local_558,"output");
  local_438 = &local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"-","");
  local_608._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_608._M_storage._M_ptr = (void *)0x0;
  local_608._M_storage._M_ptr = operator_new(0x20);
  *(undefined8 **)local_608._M_storage._M_ptr =
       (undefined8 *)((long)local_608._M_storage._M_ptr + 0x10);
  if (local_438 == &local_428) {
    *(undefined8 *)((long)local_608._M_storage._M_ptr + 0x10) = CONCAT71(uStack_427,local_428);
    *(undefined8 *)((long)local_608._M_storage._M_ptr + 0x18) = uStack_420;
  }
  else {
    *(undefined1 **)local_608._M_storage._M_ptr = local_438;
    *(ulong *)((long)local_608._M_storage._M_ptr + 0x10) = CONCAT71(uStack_427,local_428);
  }
  *(undefined8 *)((long)local_608._M_storage._M_ptr + 8) = local_430;
  local_430 = 0;
  local_428 = 0;
  local_438 = &local_428;
  std::any::operator=(&pAVar4->mDefaultValue,&local_608);
  pAVar4->field_0xbc = pAVar4->field_0xbc | 2;
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"specify the output file.","")
  ;
  std::__cxx11::string::operator=((string *)&pAVar4->mHelp,(string *)local_4d8);
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  if (local_608._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_608._M_manager)(_Op_destroy,&local_608,(_Arg *)0x0);
    local_608._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_438 != &local_428) {
    operator_delete(local_438,CONCAT71(uStack_427,local_428) + 1);
  }
  argparse::ArgumentParser::parse_args(&local_558,argc,argv);
  aArgumentName._M_str = "input";
  aArgumentName._M_len = 5;
  pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName);
  argparse::Argument::get<std::__cxx11::string>(&local_628,pAVar4);
  aArgumentName_00._M_str = "output";
  aArgumentName_00._M_len = 6;
  pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_00);
  argparse::Argument::get<std::__cxx11::string>(&local_648,pAVar4);
  std::ifstream::ifstream(&local_438);
  std::ofstream::ofstream(&local_230);
  aArgumentName_01._M_str = "-d";
  aArgumentName_01._M_len = 2;
  pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_01);
  bVar2 = argparse::Argument::get<bool>(pAVar4);
  _Var5 = (_Ios_Openmode)&local_648;
  if (bVar2) {
    aArgumentName_02._M_str = "-a";
    aArgumentName_02._M_len = 2;
    pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_02);
    bVar2 = argparse::Argument::get<bool>(pAVar4);
    if (!bVar2) {
      aArgumentName_03._M_str = "-r";
      aArgumentName_03._M_len = 2;
      pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_03);
      bVar2 = argparse::Argument::get<bool>(pAVar4);
      if ((!bVar2) &&
         (std::ifstream::open((string *)&local_438,(_Ios_Openmode)&local_628),
         (abStack_418[*(long *)(local_438 + -0x18)] & 5) == 0)) {
        iVar3 = std::__cxx11::string::compare((char *)&local_648);
        if (iVar3 == 0) {
          out_00 = (string *)&std::cout;
        }
        else {
          if ((local_628._M_string_length == local_648._M_string_length) &&
             ((local_628._M_string_length == 0 ||
              (iVar3 = bcmp(local_628._M_dataplus._M_p,local_648._M_dataplus._M_p,
                            local_628._M_string_length), iVar3 == 0)))) {
            std::__cxx11::string::append((char *)&local_648);
          }
          out_00 = (string *)&local_230;
          std::ofstream::open(out_00,_Var5);
          if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
            std::ifstream::close();
            goto LAB_00109d82;
          }
        }
        disassemble_binary((ifstream *)&local_438,(ostream *)out_00);
        goto LAB_00109bcd;
      }
    }
    goto LAB_00109d82;
  }
  aArgumentName_04._M_str = "-a";
  aArgumentName_04._M_len = 2;
  pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_04);
  bVar2 = argparse::Argument::get<bool>(pAVar4);
  if (!bVar2) {
    aArgumentName_06._M_str = "-r";
    aArgumentName_06._M_len = 2;
    pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_06);
    bVar2 = argparse::Argument::get<bool>(pAVar4);
    if ((!bVar2) ||
       (std::ifstream::open((string *)&local_438,(_Ios_Openmode)&local_628),
       (abStack_418[*(long *)(local_438 + -0x18)] & 5) != 0)) goto LAB_00109d82;
    out_01 = "-";
    iVar3 = std::__cxx11::string::compare((char *)&local_648);
    if (iVar3 != 0) {
      if ((local_628._M_string_length == local_648._M_string_length) &&
         ((local_628._M_string_length == 0 ||
          (iVar3 = bcmp(local_628._M_dataplus._M_p,local_648._M_dataplus._M_p,
                        local_628._M_string_length), iVar3 == 0)))) {
        std::__cxx11::string::append((char *)&local_648);
      }
      std::ofstream::open((string *)&local_230,_Var5);
      out_01 = (char *)pbVar6;
      if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
        std::ifstream::close();
        goto LAB_00109d82;
      }
    }
    execute((ifstream *)&local_438,(ostream *)out_01);
    goto LAB_00109bcd;
  }
  aArgumentName_05._M_str = "-d";
  aArgumentName_05._M_len = 2;
  pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_05);
  bVar2 = argparse::Argument::get<bool>(pAVar4);
  if ((bVar2) ||
     (std::ifstream::open((string *)&local_438,(_Ios_Openmode)&local_628),
     (abStack_418[*(long *)(local_438 + -0x18)] & 5) != 0)) goto LAB_00109d82;
  iVar3 = std::__cxx11::string::compare((char *)&local_648);
  _Var1._M_p = local_628._M_dataplus._M_p;
  if (iVar3 == 0) {
LAB_00109ae9:
    local_598[0] = local_588;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_598,_Var1._M_p,_Var1._M_p + local_628._M_string_length);
    std::__cxx11::string::append((char *)local_598);
    std::__cxx11::string::operator=((string *)&local_648,(string *)local_598);
    if (local_598[0] != local_588) {
      operator_delete(local_598[0],local_588[0] + 1);
    }
  }
  else if (local_628._M_string_length == local_648._M_string_length) {
    if (local_628._M_string_length == 0) {
      local_628._M_string_length = 0;
    }
    else {
      iVar3 = bcmp(local_628._M_dataplus._M_p,local_648._M_dataplus._M_p,local_628._M_string_length)
      ;
      if (iVar3 != 0) goto LAB_00109b4a;
    }
    goto LAB_00109ae9;
  }
LAB_00109b4a:
  std::ofstream::open((string *)&local_230,_Var5);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    out = (ofstream *)__dynamic_cast(&local_230,&std::ostream::typeinfo,&std::ofstream::typeinfo,0);
    aArgumentName_07._M_str = "-r";
    aArgumentName_07._M_len = 2;
    pAVar4 = argparse::ArgumentParser::operator[](&local_558,aArgumentName_07);
    bVar2 = argparse::Argument::get<bool>(pAVar4);
    assemble_text((ifstream *)&local_438,out,bVar2);
LAB_00109bcd:
    std::ifstream::close();
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _typeinfo;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    std::ifstream::~ifstream(&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != &local_648.field_2) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
    ::~_Rb_tree(&local_558.mArgumentMap._M_t);
    std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
              (&local_558.mOptionalArguments.
                super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
    std::__cxx11::_List_base<argparse::Argument,_std::allocator<argparse::Argument>_>::_M_clear
              (&local_558.mPositionalArguments.
                super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558.mProgramName._M_dataplus._M_p != &local_558.mProgramName.field_2) {
      operator_delete(local_558.mProgramName._M_dataplus._M_p,
                      local_558.mProgramName.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  std::ifstream::close();
LAB_00109d82:
  exit(2);
}

Assistant:

int main (int argc, char** argv) {
    argparse::ArgumentParser program("vm");
	program.add_argument("input")
        .required()
		.help("speicify the file to be assembled/executed.");
	program.add_argument("-d")
		.default_value(false)
		.implicit_value(true)
		.help("disassemble the binary input file.");
	program.add_argument("-a")
		.default_value(false)
		.implicit_value(true)
		.help("assemble the text input file.");
    program.add_argument("-r")
		.default_value(false)
		.implicit_value(true)
		.help("interpret the binary input file.");
    program.add_argument("output")
		.default_value(std::string("-"))
        .required()
		.help("specify the output file.");

	try {
		program.parse_args(argc, argv);
	}
	catch (const std::runtime_error& err) {
		std::cout << program;
		exit(2);
	}

	auto input_file = program.get<std::string>("input");
	auto output_file = program.get<std::string>("output");
	std::ifstream* input;
	std::ostream* output;
	std::ifstream inf;
	std::ofstream outf;
    //std::unique_ptr<vm::VM> vm;

    if (program["-d"] == true) {
        if (program["-a"] == true || program["-r"] == true) {
            exit(2);
        }
        
        inf.open(input_file, std::ios::binary | std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file != "-") {
            if (input_file == output_file) {
                output_file += ".out";
            }
            outf.open(output_file, std::ios::out | std::ios::trunc);
            if (!outf) {
                inf.close();
                exit(2);
            }
            output = &outf;
        }
        else {
            output = &std::cout;
        }
        disassemble_binary(input, output);
    }
    else if (program["-a"] == true) {
        if (program["-d"] == true) {
            exit(2);
        }
        
        inf.open(input_file, std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file == "-" || input_file == output_file) {
            output_file = input_file + ".out";
        }
        outf.open(output_file, std::ios::binary | std::ios::out | std::ios::trunc);
        if (!outf) {
            inf.close();
            exit(2);
        }
        output = &outf;
        assemble_text(input, dynamic_cast<std::ofstream*>(output), program["-r"] == true);
    }
    else if (program["-r"] == true) {
        inf.open(input_file, std::ios::binary | std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file != "-") {
            if (input_file == output_file) {
                output_file += ".out";
            }
            outf.open(output_file, std::ios::out | std::ios::trunc);
            if (!outf) {
                inf.close();
                exit(2);
            }
            output = &outf;
        }
        else {
            output = &std::cout;
        }

        execute(input, output);
    }
    else {
        exit(2);
    }
    inf.close();
    outf.close();
    return 0;
}